

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteCnf.c
# Opt level: O2

int Io_WriteCnf(Abc_Ntk_t *pNtk,char *pFileName,int fAllPrimes)

{
  sat_solver *p;
  char *pcVar1;
  size_t sStack_30;
  
  pcVar1 = "Io_WriteCnf() warning: Generating CNF by convering logic nodes into CNF clauses.";
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pcVar1 = "Io_WriteCnf() warning: Generating CNF by applying heuristic AIG to CNF conversion.";
  }
  puts(pcVar1);
  if (pNtk->vPos->nSize == 1) {
    if (pNtk->nObjCounts[8] == 0) {
      if (pNtk->nObjCounts[7] != 0) {
        if (pNtk->ntkType == ABC_NTK_LOGIC) {
          Abc_NtkToBdd(pNtk);
        }
        p = (sat_solver *)Abc_NtkMiterSatCreate(pNtk,fAllPrimes);
        if (p != (sat_solver *)0x0) {
          s_pNtk = pNtk;
          Sat_SolverWriteDimacs(p,pFileName,(lit *)0x0,(lit *)0x0,1);
          s_pNtk = (Abc_Ntk_t *)0x0;
          sat_solver_delete(p);
          return 1;
        }
        fwrite("The problem is trivially UNSAT. No CNF file is generated.\n",0x3a,1,_stdout);
        return 1;
      }
      pcVar1 = "The network has no logic nodes. No CNF file is generaled.\n";
      sStack_30 = 0x3a;
    }
    else {
      pcVar1 = "Io_WriteCnf(): Currently can only process the miter for combinational circuits.\n";
      sStack_30 = 0x50;
    }
  }
  else {
    pcVar1 = "Io_WriteCnf(): Currently can only process the miter (the network with one PO).\n";
    sStack_30 = 0x4f;
  }
  fwrite(pcVar1,sStack_30,1,_stdout);
  return 0;
}

Assistant:

int Io_WriteCnf( Abc_Ntk_t * pNtk, char * pFileName, int fAllPrimes )
{
    sat_solver * pSat;
    if ( Abc_NtkIsStrash(pNtk) )
        printf( "Io_WriteCnf() warning: Generating CNF by applying heuristic AIG to CNF conversion.\n" );
    else
        printf( "Io_WriteCnf() warning: Generating CNF by convering logic nodes into CNF clauses.\n" );
    if ( Abc_NtkPoNum(pNtk) != 1 )
    {
        fprintf( stdout, "Io_WriteCnf(): Currently can only process the miter (the network with one PO).\n" );
        return 0;
    }
    if ( Abc_NtkLatchNum(pNtk) != 0 )
    {
        fprintf( stdout, "Io_WriteCnf(): Currently can only process the miter for combinational circuits.\n" );
        return 0;
    }
    if ( Abc_NtkNodeNum(pNtk) == 0 )
    {
        fprintf( stdout, "The network has no logic nodes. No CNF file is generaled.\n" );
        return 0;
    }
    // convert to logic BDD network
    if ( Abc_NtkIsLogic(pNtk) )
        Abc_NtkToBdd( pNtk );
    // create solver with clauses
    pSat = (sat_solver *)Abc_NtkMiterSatCreate( pNtk, fAllPrimes );
    if ( pSat == NULL )
    {
        fprintf( stdout, "The problem is trivially UNSAT. No CNF file is generated.\n" );
        return 1;
    }        
    // write the clauses
    s_pNtk = pNtk;
    Sat_SolverWriteDimacs( pSat, pFileName, 0, 0, 1 );
    s_pNtk = NULL;
    // free the solver
    sat_solver_delete( pSat );
    return 1;
}